

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O2

int luaO_rawarith(lua_State *L,int op,TValue *p1,TValue *p2,TValue *res)

{
  lu_byte lVar1;
  int iVar2;
  lua_Integer lVar3;
  long v1;
  TValue *io;
  lua_Number lVar4;
  lua_Number v2;
  lua_Integer i2;
  lua_Integer i1;
  
  if ((uint)op < 0xe) {
    if ((0x2f80U >> (op & 0x1fU) & 1) != 0) {
      if (p1->tt_ == '\x03') {
        i1 = (p1->value_).i;
      }
      else {
        iVar2 = luaV_tointegerns(p1,&i1,F2Ieq);
        if (iVar2 == 0) {
          return 0;
        }
      }
      if (p2->tt_ == '\x03') {
        i2 = (p2->value_).i;
        lVar3 = i2;
        v1 = i1;
      }
      else {
        iVar2 = luaV_tointegerns(p2,&i2,F2Ieq);
        lVar3 = i2;
        v1 = i1;
        if (iVar2 == 0) {
          return 0;
        }
      }
      goto LAB_00140e77;
    }
    if ((0x30U >> (op & 0x1fU) & 1) != 0) {
      if (p1->tt_ == '\x03') {
        lVar4 = (lua_Number)(p1->value_).i;
      }
      else {
        if (p1->tt_ != '\x13') {
          return 0;
        }
        lVar4 = (p1->value_).n;
      }
      lVar1 = p2->tt_;
      goto joined_r0x00140efe;
    }
  }
  if (p1->tt_ == '\x13') {
    lVar4 = (p1->value_).n;
    lVar1 = p2->tt_;
  }
  else {
    if (p1->tt_ != '\x03') {
      return 0;
    }
    lVar1 = p2->tt_;
    if (lVar1 == '\x03') {
      lVar3 = (p2->value_).i;
      v1 = (p1->value_).i;
LAB_00140e77:
      lVar3 = intarith(L,op,v1,lVar3);
      (res->value_).i = lVar3;
      res->tt_ = '\x03';
      return 1;
    }
    lVar4 = (lua_Number)(p1->value_).i;
  }
joined_r0x00140efe:
  if (lVar1 == '\x03') {
    v2 = (lua_Number)(p2->value_).i;
  }
  else {
    if (lVar1 != '\x13') {
      return 0;
    }
    v2 = (p2->value_).n;
  }
  lVar4 = numarith(L,op,lVar4,v2);
  (res->value_).n = lVar4;
  res->tt_ = '\x13';
  return 1;
}

Assistant:

int luaO_rawarith (lua_State *L, int op, const TValue *p1, const TValue *p2,
                   TValue *res) {
  switch (op) {
    case LUA_OPBAND: case LUA_OPBOR: case LUA_OPBXOR:
    case LUA_OPSHL: case LUA_OPSHR:
    case LUA_OPBNOT: {  /* operate only on integers */
      lua_Integer i1; lua_Integer i2;
      if (tointegerns(p1, &i1) && tointegerns(p2, &i2)) {
        setivalue(res, intarith(L, op, i1, i2));
        return 1;
      }
      else return 0;  /* fail */
    }
    case LUA_OPDIV: case LUA_OPPOW: {  /* operate only on floats */
      lua_Number n1; lua_Number n2;
      if (tonumberns(p1, n1) && tonumberns(p2, n2)) {
        setfltvalue(res, numarith(L, op, n1, n2));
        return 1;
      }
      else return 0;  /* fail */
    }
    default: {  /* other operations */
      lua_Number n1; lua_Number n2;
      if (ttisinteger(p1) && ttisinteger(p2)) {
        setivalue(res, intarith(L, op, ivalue(p1), ivalue(p2)));
        return 1;
      }
      else if (tonumberns(p1, n1) && tonumberns(p2, n2)) {
        setfltvalue(res, numarith(L, op, n1, n2));
        return 1;
      }
      else return 0;  /* fail */
    }
  }
}